

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule(cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar1;
  bool bVar2;
  TargetType TVar3;
  TargetType targetType;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  char *pcVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  cmOutputConverter *outputConverter;
  string *linkCmd_1;
  pointer __rhs;
  allocator<char> local_63c;
  allocator<char> local_63b;
  allocator<char> local_63a;
  allocator<char> local_639;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandLines;
  string langFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string launcher;
  string responseFlag;
  string targetVersionMajor;
  string linkCmd;
  string targetVersionMinor;
  string local_528;
  string local_508;
  string rspcontent;
  string rspfile;
  string local_4a8;
  string local_488;
  string ruleName;
  RuleVariables vars;
  ostringstream description;
  ostringstream comment;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  TVar3 = cmGeneratorTarget::GetType
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  LanguageLinkerRule_abi_cxx11_(&ruleName,this);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  rspfile._M_string_length = 0;
  rspfile.field_2._M_local_buf[0] = '\0';
  rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
  rspcontent._M_string_length = 0;
  rspcontent.field_2._M_local_buf[0] = '\0';
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar2 = cmGlobalNinjaGenerator::HasRule(pcVar4,&ruleName);
  if (!bVar2) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables(&vars);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    vars.CMTargetName = (psVar5->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType
                           ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget);
    vars.CMTargetType = cmState::GetTargetTypeName(targetType);
    psVar5 = &this->TargetLinkLanguage;
    vars.Language = (this->TargetLinkLanguage)._M_dataplus._M_p;
    bVar2 = std::operator==(psVar5,"Swift");
    if (bVar2) {
      vars.SwiftPartialModules = "$SWIFT_PARTIAL_MODULES";
      vars.TargetSwiftModule = "$TARGET_SWIFT_MODULE";
      vars.TargetSwiftDoc = "$TARGET_SWIFT_DOC";
    }
    responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
    responseFlag._M_string_length = 0;
    responseFlag.field_2._M_local_buf[0] = '\0';
    if (useResponseFile) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&comment,"CMAKE_",(allocator<char> *)&description);
      std::__cxx11::string::append((string *)&comment);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &description,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     "_RESPONSE_FILE_LINK_FLAG");
      cmMakefile::GetDefinition
                ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                 (string *)&description);
      std::__cxx11::string::assign((char *)&responseFlag);
      std::__cxx11::string::assign((char *)&rspfile);
      std::__cxx11::string::append((string *)&responseFlag);
      cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::assign((char *)&rspcontent);
      std::__cxx11::string::append((char *)&rspcontent);
      vars.Objects = responseFlag._M_dataplus._M_p;
      vars.LinkLibraries = "";
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&comment);
    }
    else {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    }
    vars.ObjectDir = "$OBJECT_DIR";
    vars.Target = "$TARGET_FILE";
    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";
    targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
    targetVersionMajor._M_string_length = 0;
    targetVersionMajor.field_2._M_local_buf[0] = '\0';
    targetVersionMinor._M_dataplus._M_p = (pointer)&targetVersionMinor.field_2;
    targetVersionMinor._M_string_length = 0;
    targetVersionMinor.field_2._M_local_buf[0] = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    cmGeneratorTarget::GetTargetVersion
              ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               (int *)&launcher,(int *)&linkCmd);
    std::ostream::operator<<(&comment,(int)launcher._M_dataplus._M_p);
    std::ostream::operator<<(&description,(int)linkCmd._M_dataplus._M_p);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMajor,(string *)&langFlags);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMinor,(string *)&langFlags);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    vars.TargetVersionMajor = targetVersionMajor._M_dataplus._M_p;
    vars.TargetVersionMinor = targetVersionMinor._M_dataplus._M_p;
    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
    langFlags._M_string_length = 0;
    vars.Manifests = "$MANIFESTS";
    langFlags.field_2._M_local_buf[0] = '\0';
    if (TVar3 != EXECUTABLE) {
      std::__cxx11::string::append((char *)&langFlags);
      vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
    }
    launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
    launcher._M_string_length = 0;
    launcher.field_2._M_local_buf[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&comment,"RULE_LAUNCH_LINK",(allocator<char> *)&description);
    pcVar6 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar1,target,(string *)&comment)
    ;
    std::__cxx11::string::~string((string *)&comment);
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      std::__cxx11::string::assign((char *)&launcher);
      std::__cxx11::string::append((char *)&launcher);
    }
    rulePlaceholderExpander._M_t.
    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
         (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
           super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    rulePlaceholderExpander._M_t.
    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
    ComputeLinkCmd_abi_cxx11_(&linkCmds,this);
    for (__rhs = linkCmds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __rhs != linkCmds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     &launcher,__rhs);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&comment);
      std::__cxx11::string::~string((string *)&comment);
      pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar1 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)
                 rulePlaceholderExpander._M_t.
                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,
                 outputConverter,__rhs,&vars);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&linkCmds);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&comment,"$PRE_LINK",(allocator<char> *)&description);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&linkCmds,
                     (const_iterator)
                     linkCmds.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(value_type *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkCmds,
               (char (*) [12])"$POST_BUILD");
    _comment = (pointer)local_198;
    local_198[0]._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&linkCmd,(this->super_cmNinjaTargetGenerator).LocalGenerator,&linkCmds,
               (string *)&comment,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    poVar7 = std::operator<<((ostream *)&comment,"Rule for linking ");
    poVar7 = std::operator<<(poVar7,(string *)psVar5);
    poVar7 = std::operator<<(poVar7," ");
    pcVar6 = GetVisibleTypeName(this);
    poVar7 = std::operator<<(poVar7,pcVar6);
    std::operator<<(poVar7,".");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    poVar7 = std::operator<<((ostream *)&description,"Linking ");
    poVar7 = std::operator<<(poVar7,(string *)psVar5);
    poVar7 = std::operator<<(poVar7," ");
    pcVar6 = GetVisibleTypeName(this);
    poVar7 = std::operator<<(poVar7,pcVar6);
    std::operator<<(poVar7," $TARGET_FILE");
    pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>((string *)&commandLines,"",&local_63a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"",&local_63b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"$RESTAT",&local_63c);
    cmGlobalNinjaGenerator::AddRule
              (pcVar4,&ruleName,&linkCmd,&local_508,&local_528,(string *)&commandLines,&local_488,
               &rspfile,&rspcontent,&local_4a8,false);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&commandLines);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::__cxx11::string::~string((string *)&linkCmd);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkCmds);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr(&rulePlaceholderExpander);
    std::__cxx11::string::~string((string *)&launcher);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::string::~string((string *)&targetVersionMinor);
    std::__cxx11::string::~string((string *)&targetVersionMajor);
    std::__cxx11::string::~string((string *)&responseFlag);
  }
  bVar2 = std::operator!=(&(this->TargetNames).Output,&(this->TargetNames).Real);
  if ((bVar2) &&
     (bVar2 = cmGeneratorTarget::IsFrameworkOnApple
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget), !bVar2)) {
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&comment,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar5,SHELL);
    if (TVar3 == EXECUTABLE) {
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &description,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     " -E cmake_symlink_executable $in $out");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLines,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description);
      std::__cxx11::string::~string((string *)&description);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLines,
                 (char (*) [12])"$POST_BUILD");
      pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&description,"CMAKE_SYMLINK_EXECUTABLE",(allocator<char> *)&local_488);
      responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
      responseFlag._M_string_length = 0;
      responseFlag.field_2._M_local_buf[0] = '\0';
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)&vars,(this->super_cmNinjaTargetGenerator).LocalGenerator,&commandLines,
                 &responseFlag,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetVersionMajor,"Creating executable symlink $out",
                 (allocator<char> *)&local_4a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetVersionMinor,"Rule for creating executable symlink.",
                 (allocator<char> *)&linkCmds);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&langFlags,"",(allocator<char> *)&rulePlaceholderExpander);
      std::__cxx11::string::string<std::allocator<char>>((string *)&launcher,"",&local_63a);
      std::__cxx11::string::string<std::allocator<char>>((string *)&linkCmd,"",&local_63b);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"",&local_63c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"",&local_639);
      cmGlobalNinjaGenerator::AddRule
                (pcVar4,(string *)&description,(string *)&vars,&targetVersionMajor,
                 &targetVersionMinor,&langFlags,&launcher,&linkCmd,&local_508,&local_528,false);
    }
    else {
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      commandLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &description,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     " -E cmake_symlink_library $in $SONAME $out");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLines,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description);
      std::__cxx11::string::~string((string *)&description);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLines,
                 (char (*) [12])"$POST_BUILD");
      pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&description,"CMAKE_SYMLINK_LIBRARY",(allocator<char> *)&local_488);
      responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
      responseFlag._M_string_length = 0;
      responseFlag.field_2._M_local_buf[0] = '\0';
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)&vars,(this->super_cmNinjaTargetGenerator).LocalGenerator,&commandLines,
                 &responseFlag,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetVersionMajor,"Creating library symlink $out",
                 (allocator<char> *)&local_4a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetVersionMinor,"Rule for creating library symlink.",
                 (allocator<char> *)&linkCmds);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&langFlags,"",(allocator<char> *)&rulePlaceholderExpander);
      std::__cxx11::string::string<std::allocator<char>>((string *)&launcher,"",&local_63a);
      std::__cxx11::string::string<std::allocator<char>>((string *)&linkCmd,"",&local_63b);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"",&local_63c);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"",&local_639);
      cmGlobalNinjaGenerator::AddRule
                (pcVar4,(string *)&description,(string *)&vars,&targetVersionMajor,
                 &targetVersionMinor,&langFlags,&launcher,&linkCmd,&local_508,&local_528,false);
    }
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&linkCmd);
    std::__cxx11::string::~string((string *)&launcher);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::string::~string((string *)&targetVersionMinor);
    std::__cxx11::string::~string((string *)&targetVersionMajor);
    std::__cxx11::string::~string((string *)&vars);
    std::__cxx11::string::~string((string *)&responseFlag);
    std::__cxx11::string::~string((string *)&description);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commandLines);
    std::__cxx11::string::~string((string *)&comment);
  }
  std::__cxx11::string::~string((string *)&rspcontent);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&ruleName);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();
  std::string ruleName = this->LanguageLinkerRule();

  // Select whether to use a response file for objects.
  std::string rspfile;
  std::string rspcontent;

  if (!this->GetGlobalGenerator()->HasRule(ruleName)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());

    vars.Language = this->TargetLinkLanguage.c_str();
    if (this->TargetLinkLanguage == "Swift") {
      vars.SwiftPartialModules = "$SWIFT_PARTIAL_MODULES";
      vars.TargetSwiftModule = "$TARGET_SWIFT_MODULE";
      vars.TargetSwiftDoc = "$TARGET_SWIFT_DOC";
    }

    std::string responseFlag;
    if (!useResponseFile) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      std::string cmakeVarLang = "CMAKE_";
      cmakeVarLang += this->TargetLinkLanguage;

      // build response file name
      std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
      const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);
      if (flag) {
        responseFlag = flag;
      } else {
        responseFlag = "@";
      }
      rspfile = "$RSP_FILE";
      responseFlag += rspfile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rspcontent = "$in";
      } else {
        rspcontent = "$in_newline";
      }
      rspcontent += " $LINK_PATH $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = launcher + linkCmd;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    std::string linkCmd =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    std::ostringstream comment;
    comment << "Rule for linking " << this->TargetLinkLanguage << " "
            << this->GetVisibleTypeName() << ".";
    std::ostringstream description;
    description << "Linking " << this->TargetLinkLanguage << " "
                << this->GetVisibleTypeName() << " $TARGET_FILE";
    this->GetGlobalGenerator()->AddRule(ruleName, linkCmd, description.str(),
                                        comment.str(),
                                        /*depfile*/ "",
                                        /*deptype*/ "", rspfile, rspcontent,
                                        /*restat*/ "$RESTAT",
                                        /*generator*/ false);
  }

  if (this->TargetNames.Output != this->TargetNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      std::vector<std::string> commandLines;
      commandLines.push_back(cmakeCommand +
                             " -E cmake_symlink_executable $in $out");
      commandLines.emplace_back("$POST_BUILD");

      this->GetGlobalGenerator()->AddRule(
        "CMAKE_SYMLINK_EXECUTABLE",
        this->GetLocalGenerator()->BuildCommandLine(commandLines),
        "Creating executable symlink $out",
        "Rule for creating "
        "executable symlink.",
        /*depfile*/ "",
        /*deptype*/ "",
        /*rspfile*/ "",
        /*rspcontent*/ "",
        /*restat*/ "",
        /*generator*/ false);
    } else {
      std::vector<std::string> commandLines;
      commandLines.push_back(cmakeCommand +
                             " -E cmake_symlink_library $in $SONAME $out");
      commandLines.emplace_back("$POST_BUILD");

      this->GetGlobalGenerator()->AddRule(
        "CMAKE_SYMLINK_LIBRARY",
        this->GetLocalGenerator()->BuildCommandLine(commandLines),
        "Creating library symlink $out",
        "Rule for creating "
        "library symlink.",
        /*depfile*/ "",
        /*deptype*/ "",
        /*rspfile*/ "",
        /*rspcontent*/ "",
        /*restat*/ "",
        /*generator*/ false);
    }
  }
}